

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int bytes_be_to_int(uchar *bytes)

{
  long in_RDI;
  long in_FS_OFFSET;
  uint i;
  uchar *pResult;
  int Result;
  uint local_24;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    *(undefined1 *)((long)&local_c + (ulong)local_24) =
         *(undefined1 *)(in_RDI + (3 - (ulong)local_24));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

int bytes_be_to_int(const unsigned char *bytes)
{
	int Result;
	unsigned char *pResult = (unsigned char *)&Result;
	for(unsigned i = 0; i < sizeof(int); i++)
	{
#if defined(CONF_ARCH_ENDIAN_BIG)
		pResult[i] = bytes[i];
#else
		pResult[i] = bytes[sizeof(int) - i - 1];
#endif
	}
	return Result;
}